

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3Fts5ConfigSetValue(Fts5Config *pConfig,char *zKey,sqlite3_value *pVal,int *pbBadkey)

{
  int iVar1;
  char *local_58;
  char *zRankArgs;
  char *zRank;
  char *zIn;
  int nCrisisMerge;
  int nUsermerge;
  int nAutomerge;
  int nHashSize;
  int pgsz;
  int rc;
  int *pbBadkey_local;
  sqlite3_value *pVal_local;
  char *zKey_local;
  Fts5Config *pConfig_local;
  
  nHashSize = 0;
  _pgsz = pbBadkey;
  pbBadkey_local = (int *)pVal;
  pVal_local = (sqlite3_value *)zKey;
  zKey_local = (char *)pConfig;
  iVar1 = sqlite3_stricmp(zKey,"pgsz");
  if (iVar1 == 0) {
    nAutomerge = 0;
    iVar1 = sqlite3_value_numeric_type((sqlite3_value *)pbBadkey_local);
    if (iVar1 == 1) {
      nAutomerge = sqlite3_value_int((sqlite3_value *)pbBadkey_local);
    }
    if ((nAutomerge < 1) || (0x20000 < nAutomerge)) {
      *_pgsz = 1;
    }
    else {
      *(int *)(zKey_local + 0x7c) = nAutomerge;
    }
  }
  else {
    iVar1 = sqlite3_stricmp((char *)pVal_local,"hashsize");
    if (iVar1 == 0) {
      nUsermerge = -1;
      iVar1 = sqlite3_value_numeric_type((sqlite3_value *)pbBadkey_local);
      if (iVar1 == 1) {
        nUsermerge = sqlite3_value_int((sqlite3_value *)pbBadkey_local);
      }
      if (nUsermerge < 1) {
        *_pgsz = 1;
      }
      else {
        *(int *)(zKey_local + 0x8c) = nUsermerge;
      }
    }
    else {
      iVar1 = sqlite3_stricmp((char *)pVal_local,"automerge");
      if (iVar1 == 0) {
        nCrisisMerge = -1;
        iVar1 = sqlite3_value_numeric_type((sqlite3_value *)pbBadkey_local);
        if (iVar1 == 1) {
          nCrisisMerge = sqlite3_value_int((sqlite3_value *)pbBadkey_local);
        }
        if ((nCrisisMerge < 0) || (0x40 < nCrisisMerge)) {
          *_pgsz = 1;
        }
        else {
          if (nCrisisMerge == 1) {
            nCrisisMerge = 4;
          }
          *(int *)(zKey_local + 0x80) = nCrisisMerge;
        }
      }
      else {
        iVar1 = sqlite3_stricmp((char *)pVal_local,"usermerge");
        if (iVar1 == 0) {
          zIn._4_4_ = -1;
          iVar1 = sqlite3_value_numeric_type((sqlite3_value *)pbBadkey_local);
          if (iVar1 == 1) {
            zIn._4_4_ = sqlite3_value_int((sqlite3_value *)pbBadkey_local);
          }
          if ((zIn._4_4_ < 2) || (0x10 < zIn._4_4_)) {
            *_pgsz = 1;
          }
          else {
            *(int *)(zKey_local + 0x88) = zIn._4_4_;
          }
        }
        else {
          iVar1 = sqlite3_stricmp((char *)pVal_local,"crisismerge");
          if (iVar1 == 0) {
            zIn._0_4_ = -1;
            iVar1 = sqlite3_value_numeric_type((sqlite3_value *)pbBadkey_local);
            if (iVar1 == 1) {
              zIn._0_4_ = sqlite3_value_int((sqlite3_value *)pbBadkey_local);
            }
            if ((int)zIn < 0) {
              *_pgsz = 1;
            }
            else {
              if ((int)zIn < 2) {
                zIn._0_4_ = 0x10;
              }
              *(int *)(zKey_local + 0x84) = (int)zIn;
            }
          }
          else {
            iVar1 = sqlite3_stricmp((char *)pVal_local,"rank");
            if (iVar1 == 0) {
              zRank = (char *)sqlite3_value_text((sqlite3_value *)pbBadkey_local);
              nHashSize = sqlite3Fts5ConfigParseRank(zRank,&zRankArgs,&local_58);
              if (nHashSize == 0) {
                sqlite3_free(*(void **)(zKey_local + 0x90));
                sqlite3_free(*(void **)(zKey_local + 0x98));
                *(char **)(zKey_local + 0x90) = zRankArgs;
                *(char **)(zKey_local + 0x98) = local_58;
              }
              else if (nHashSize == 1) {
                nHashSize = 0;
                *_pgsz = 1;
              }
            }
            else {
              *_pgsz = 1;
            }
          }
        }
      }
    }
  }
  return nHashSize;
}

Assistant:

static int sqlite3Fts5ConfigSetValue(
  Fts5Config *pConfig, 
  const char *zKey, 
  sqlite3_value *pVal,
  int *pbBadkey
){
  int rc = SQLITE_OK;

  if( 0==sqlite3_stricmp(zKey, "pgsz") ){
    int pgsz = 0;
    if( SQLITE_INTEGER==sqlite3_value_numeric_type(pVal) ){
      pgsz = sqlite3_value_int(pVal);
    }
    if( pgsz<=0 || pgsz>FTS5_MAX_PAGE_SIZE ){
      *pbBadkey = 1;
    }else{
      pConfig->pgsz = pgsz;
    }
  }

  else if( 0==sqlite3_stricmp(zKey, "hashsize") ){
    int nHashSize = -1;
    if( SQLITE_INTEGER==sqlite3_value_numeric_type(pVal) ){
      nHashSize = sqlite3_value_int(pVal);
    }
    if( nHashSize<=0 ){
      *pbBadkey = 1;
    }else{
      pConfig->nHashSize = nHashSize;
    }
  }

  else if( 0==sqlite3_stricmp(zKey, "automerge") ){
    int nAutomerge = -1;
    if( SQLITE_INTEGER==sqlite3_value_numeric_type(pVal) ){
      nAutomerge = sqlite3_value_int(pVal);
    }
    if( nAutomerge<0 || nAutomerge>64 ){
      *pbBadkey = 1;
    }else{
      if( nAutomerge==1 ) nAutomerge = FTS5_DEFAULT_AUTOMERGE;
      pConfig->nAutomerge = nAutomerge;
    }
  }

  else if( 0==sqlite3_stricmp(zKey, "usermerge") ){
    int nUsermerge = -1;
    if( SQLITE_INTEGER==sqlite3_value_numeric_type(pVal) ){
      nUsermerge = sqlite3_value_int(pVal);
    }
    if( nUsermerge<2 || nUsermerge>16 ){
      *pbBadkey = 1;
    }else{
      pConfig->nUsermerge = nUsermerge;
    }
  }

  else if( 0==sqlite3_stricmp(zKey, "crisismerge") ){
    int nCrisisMerge = -1;
    if( SQLITE_INTEGER==sqlite3_value_numeric_type(pVal) ){
      nCrisisMerge = sqlite3_value_int(pVal);
    }
    if( nCrisisMerge<0 ){
      *pbBadkey = 1;
    }else{
      if( nCrisisMerge<=1 ) nCrisisMerge = FTS5_DEFAULT_CRISISMERGE;
      pConfig->nCrisisMerge = nCrisisMerge;
    }
  }

  else if( 0==sqlite3_stricmp(zKey, "rank") ){
    const char *zIn = (const char*)sqlite3_value_text(pVal);
    char *zRank;
    char *zRankArgs;
    rc = sqlite3Fts5ConfigParseRank(zIn, &zRank, &zRankArgs);
    if( rc==SQLITE_OK ){
      sqlite3_free(pConfig->zRank);
      sqlite3_free(pConfig->zRankArgs);
      pConfig->zRank = zRank;
      pConfig->zRankArgs = zRankArgs;
    }else if( rc==SQLITE_ERROR ){
      rc = SQLITE_OK;
      *pbBadkey = 1;
    }
  }else{
    *pbBadkey = 1;
  }
  return rc;
}